

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_rdft.cc
# Opt level: O3

void cftfsub_128_C(float *a)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  
  (*cft1st_128)(a);
  (*cftmdl_128)(a);
  lVar5 = -0x10;
  do {
    pfVar1 = a + lVar5 * 2 + 0x20;
    pfVar2 = a + lVar5 * 2 + 0x24;
    pfVar3 = a + lVar5 * 2 + 0x40;
    pfVar4 = a + lVar5 * 2 + 0x44;
    fVar22 = *pfVar1 + *pfVar3;
    fVar23 = pfVar1[2] + pfVar3[2];
    fVar24 = *pfVar2 + *pfVar4;
    fVar25 = pfVar2[2] + pfVar4[2];
    fVar26 = pfVar1[1] + pfVar3[1];
    fVar27 = pfVar1[3] + pfVar3[3];
    fVar28 = pfVar2[1] + pfVar4[1];
    fVar29 = pfVar2[3] + pfVar4[3];
    fVar10 = *pfVar1 - *pfVar3;
    fVar11 = pfVar1[2] - pfVar3[2];
    fVar12 = *pfVar2 - *pfVar4;
    fVar13 = pfVar2[2] - pfVar4[2];
    fVar6 = pfVar1[1] - pfVar3[1];
    fVar7 = pfVar1[3] - pfVar3[3];
    fVar8 = pfVar2[1] - pfVar4[1];
    fVar9 = pfVar2[3] - pfVar4[3];
    pfVar1 = a + lVar5 * 2 + 100;
    pfVar2 = a + lVar5 * 2 + 0x60;
    pfVar3 = a + lVar5 * 2 + 0x84;
    pfVar4 = a + lVar5 * 2 + 0x80;
    fVar30 = *pfVar2 + *pfVar4;
    fVar31 = pfVar2[2] + pfVar4[2];
    fVar32 = *pfVar1 + *pfVar3;
    fVar33 = pfVar1[2] + pfVar3[2];
    fVar34 = pfVar2[1] + pfVar4[1];
    fVar35 = pfVar2[3] + pfVar4[3];
    fVar36 = pfVar1[1] + pfVar3[1];
    fVar37 = pfVar1[3] + pfVar3[3];
    fVar18 = *pfVar2 - *pfVar4;
    fVar19 = pfVar2[2] - pfVar4[2];
    fVar20 = *pfVar1 - *pfVar3;
    fVar21 = pfVar1[2] - pfVar3[2];
    fVar14 = pfVar2[1] - pfVar4[1];
    fVar15 = pfVar2[3] - pfVar4[3];
    fVar16 = pfVar1[1] - pfVar3[1];
    fVar17 = pfVar1[3] - pfVar3[3];
    pfVar1 = a + lVar5 * 2 + 0x20;
    *pfVar1 = fVar22 + fVar30;
    pfVar1[1] = fVar26 + fVar34;
    pfVar1[2] = fVar23 + fVar31;
    pfVar1[3] = fVar27 + fVar35;
    pfVar1 = a + lVar5 * 2 + 0x24;
    *pfVar1 = fVar24 + fVar32;
    pfVar1[1] = fVar28 + fVar36;
    pfVar1[2] = fVar25 + fVar33;
    pfVar1[3] = fVar29 + fVar37;
    pfVar1 = a + lVar5 * 2 + 0x60;
    *pfVar1 = fVar22 - fVar30;
    pfVar1[1] = fVar26 - fVar34;
    pfVar1[2] = fVar23 - fVar31;
    pfVar1[3] = fVar27 - fVar35;
    pfVar1 = a + lVar5 * 2 + 100;
    *pfVar1 = fVar24 - fVar32;
    pfVar1[1] = fVar28 - fVar36;
    pfVar1[2] = fVar25 - fVar33;
    pfVar1[3] = fVar29 - fVar37;
    pfVar1 = a + lVar5 * 2 + 0x40;
    *pfVar1 = fVar10 - fVar14;
    pfVar1[1] = fVar6 + fVar18;
    pfVar1[2] = fVar11 - fVar15;
    pfVar1[3] = fVar7 + fVar19;
    pfVar1 = a + lVar5 * 2 + 0x44;
    *pfVar1 = fVar12 - fVar16;
    pfVar1[1] = fVar8 + fVar20;
    pfVar1[2] = fVar13 - fVar17;
    pfVar1[3] = fVar9 + fVar21;
    pfVar1 = a + lVar5 * 2 + 0x80;
    *pfVar1 = fVar14 + fVar10;
    pfVar1[1] = fVar6 - fVar18;
    pfVar1[2] = fVar15 + fVar11;
    pfVar1[3] = fVar7 - fVar19;
    pfVar1 = a + lVar5 * 2 + 0x84;
    *pfVar1 = fVar16 + fVar12;
    pfVar1[1] = fVar8 - fVar20;
    pfVar1[2] = fVar17 + fVar13;
    pfVar1[3] = fVar9 - fVar21;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0);
  return;
}

Assistant:

static void cftfsub_128_C(float* a) {
  int j, j1, j2, j3, l;
  float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  cft1st_128(a);
  cftmdl_128(a);
  l = 32;
  for (j = 0; j < l; j += 2) {
    j1 = j + l;
    j2 = j1 + l;
    j3 = j2 + l;
    x0r = a[j] + a[j1];
    x0i = a[j + 1] + a[j1 + 1];
    x1r = a[j] - a[j1];
    x1i = a[j + 1] - a[j1 + 1];
    x2r = a[j2] + a[j3];
    x2i = a[j2 + 1] + a[j3 + 1];
    x3r = a[j2] - a[j3];
    x3i = a[j2 + 1] - a[j3 + 1];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j2] = x0r - x2r;
    a[j2 + 1] = x0i - x2i;
    a[j1] = x1r - x3i;
    a[j1 + 1] = x1i + x3r;
    a[j3] = x1r + x3i;
    a[j3 + 1] = x1i - x3r;
  }
}